

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O2

bool __thiscall
ser::Serializer::RegisterField
          (Serializer *this,string *name,string *type,int bytesPerElement,int iSize,int jSize,
          int kSize,int lSize,int iMinusHalo,int iPlusHalo,int jMinusHalo,int jPlusHalo,
          int kMinusHalo,int kPlusHalo,int lMinusHalo,int lPlusHalo)

{
  bool bVar1;
  DataFieldInfo *other_00;
  ostream *poVar2;
  SerializationException *pSVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  string local_380 [32];
  string local_360;
  string local_340;
  SerializationException exception_1;
  DataFieldInfo other;
  DataFieldInfo info;
  ostringstream errorstr;
  
  if ((((iSize < 1) || (jSize < 1)) || (kSize < 1)) || (lSize < 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorstr);
    poVar2 = std::operator<<((ostream *)&errorstr,"Error: field ");
    poVar2 = std::operator<<(poVar2,(string *)name);
    poVar2 = std::operator<<(poVar2," is registered with sizes: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iSize);
    poVar2 = std::operator<<(poVar2,"x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,jSize);
    poVar2 = std::operator<<(poVar2,"x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,kSize);
    poVar2 = std::operator<<(poVar2,"x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lSize);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Sizes must be larger than 0 for all dimensions\n");
    info.name_._M_string_length = (long)&info.name_.field_2 + 8;
    info.name_._M_dataplus._M_p = (pointer)&PTR__SerializationException_00199680;
    info.name_.field_2._M_allocated_capacity = 0;
    info.name_.field_2._M_local_buf[8] = '\0';
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&info.name_._M_string_length);
    std::__cxx11::string::~string((string *)&other);
    pSVar3 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar3,(SerializationException *)&info);
    __cxa_throw(pSVar3,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  DataFieldInfo::DataFieldInfo(&info);
  std::__cxx11::string::string((string *)&local_340,(string *)name);
  std::__cxx11::string::string((string *)&local_360,(string *)type);
  DataFieldInfo::Init(&info,&local_340,&local_360,bytesPerElement,
                      (uint)(lSize != 1) +
                      (uint)(kSize != 1) + (uint)(jSize != 1) + (uint)(iSize != 1),iSize,jSize,kSize
                      ,lSize,iMinusHalo,iPlusHalo,jMinusHalo,jPlusHalo,kMinusHalo,kPlusHalo,
                      lMinusHalo,lPlusHalo);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  DataFieldInfo::DataFieldInfo(&other);
  other_00 = FieldsTable::Find(&this->fieldsTable_,name);
  DataFieldInfo::operator=(&other,other_00);
  bVar1 = std::operator!=(type,&other.type_);
  auVar4._0_4_ = -(uint)(iSize == other.iSize_);
  auVar4._4_4_ = -(uint)(jSize == other.jSize_);
  auVar4._8_4_ = -(uint)(kSize == other.kSize_);
  auVar4._12_4_ = -(uint)(lSize == other.lSize_);
  auVar5._0_4_ = -(uint)(iPlusHalo == other.iPlusHalo_);
  auVar5._4_4_ = -(uint)(iMinusHalo == other.iMinusHalo_);
  auVar5._8_4_ = -(uint)(jPlusHalo == other.jPlusHalo_);
  auVar5._12_4_ = -(uint)(jMinusHalo == other.jMinusHalo_);
  auVar5 = packssdw(auVar4,auVar5);
  auVar5 = packsswb(auVar5,auVar5);
  if ((((((byte)(SUB161(auVar5 >> 7,0) & 1 | (SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar5 >> 0x17,0) & 1) << 2 | (SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar5 >> 0x27,0) & 1) << 4 | (SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar5 >> 0x37,0) & 1) << 6 | SUB161(auVar5 >> 0x3f,0) << 7) == 0xff) &&
        (other.bytesPerElement_ == bytesPerElement)) &&
       ((other.kMinusHalo_ == kMinusHalo &&
        ((other.kPlusHalo_ == kPlusHalo && (other.lMinusHalo_ == lMinusHalo)))))) && (!bVar1)) &&
     (other.lPlusHalo_ == lPlusHalo)) {
    DataFieldInfo::~DataFieldInfo(&other);
    DataFieldInfo::~DataFieldInfo(&info);
    return false;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorstr);
  poVar2 = std::operator<<((ostream *)&errorstr,"Error: field ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2," was already registered into ");
  std::operator<<(poVar2,"serializer with different information");
  exception_1.message_._M_dataplus._M_p = (pointer)&exception_1.message_.field_2;
  exception_1._0_8_ = &PTR__SerializationException_00199680;
  exception_1.message_._M_string_length = 0;
  exception_1.message_.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&exception_1.message_);
  std::__cxx11::string::~string(local_380);
  pSVar3 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(pSVar3,&exception_1);
  __cxa_throw(pSVar3,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

bool Serializer::RegisterField(const std::string& name, std::string type, int bytesPerElement,
            int iSize, int jSize, int kSize, int lSize,
            int iMinusHalo, int iPlusHalo, int jMinusHalo, int jPlusHalo,
            int kMinusHalo, int kPlusHalo, int lMinusHalo, int lPlusHalo
        )
{
    // Check that sizes are >= 1
    if (iSize < 1 || jSize < 1 || kSize < 1 || lSize < 1)
    {
        std::ostringstream errorstr;
        errorstr << "Error: field " << name << " is registered with sizes: "
            << iSize << "x" << jSize << "x" << kSize << "x" << lSize << "\n"
            << "Sizes must be larger than 0 for all dimensions\n";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    // Compute rank
    int rank = (iSize != 1 ? 1: 0) + (jSize != 1 ? 1: 0)
             + (kSize != 1 ? 1: 0) + (lSize != 1 ? 1: 0);

    // Create info object
    DataFieldInfo info;
    info.Init(name, type, bytesPerElement, rank,
              iSize, jSize, kSize, lSize,
              iMinusHalo, iPlusHalo, jMinusHalo, jPlusHalo,
              kMinusHalo, kPlusHalo, lMinusHalo, lPlusHalo);

    DataFieldInfo other;
    try
    {
        other = fieldsTable_.Find(name);
    }
    catch (SerializationException&)
    {
        // Field does not exist: register and exit
        fieldsTable_.RegisterField(info);
        return true;
    }

    // Field was alredy registered: check info
    if (   type != other.type()
        || bytesPerElement != other.bytesPerElement()
        || iSize != other.iSize()
        || jSize != other.jSize()
        || kSize != other.kSize()
        || lSize != other.lSize()
        || iMinusHalo != other.iMinusHaloSize()
        || iPlusHalo  != other.iPlusHaloSize()
        || jMinusHalo != other.jMinusHaloSize()
        || jPlusHalo  != other.jPlusHaloSize()
        || kMinusHalo != other.kMinusHaloSize()
        || kPlusHalo  != other.kPlusHaloSize()
        || lMinusHalo != other.lMinusHaloSize()
        || lPlusHalo  != other.lPlusHaloSize()
       )
    {
        std::ostringstream errorstr;
        errorstr << "Error: field " << name << " was already registered into "
            << "serializer with different information";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    return false;
}